

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

Tree * jhu::thrax::readTree(Tree *__return_storage_ptr__,string_view line)

{
  bool bVar1;
  bool bVar2;
  size_type __n;
  reference pbVar3;
  const_reference pvVar4;
  reference pvVar5;
  invalid_argument *piVar6;
  char *in_RCX;
  string_view line_00;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_162;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined4 uStack_d4;
  size_t local_d0;
  char *local_c8;
  Node *local_c0;
  undefined2 local_b2;
  undefined1 auStack_b0 [6];
  IndexType start;
  basic_string_view<char,_std::char_traits<char>_> t;
  iterator __end2;
  iterator __begin2;
  Sentence *__range2;
  Node *curr;
  size_t nextNodeIndex;
  basic_string_view<char,_std::char_traits<char>_> *local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  size_type local_50;
  difference_type nodeCount;
  char *pcStack_40;
  undefined1 local_38 [8];
  Sentence tokens;
  string_view line_local;
  Tree *result;
  
  line_00._M_len = line._M_str;
  nodeCount = line._M_len;
  line_00._M_str = in_RCX;
  pcStack_40 = line_00._M_len;
  tokens.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nodeCount;
  split((Sentence *)local_38,(thrax *)nodeCount,line_00);
  local_58 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((Sentence *)local_38);
  local_60 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((Sentence *)local_38);
  __n = std::
        count_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,jhu::thrax::readTree(std::basic_string_view<char,std::char_traits<char>>)::__0>
                  (local_58,local_60);
  nextNodeIndex._3_1_ = 0;
  local_50 = __n;
  std::allocator<jhu::thrax::Node>::allocator
            ((allocator<jhu::thrax::Node> *)((long)&nextNodeIndex + 2));
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::vector
            (__return_storage_ptr__,__n,(allocator<jhu::thrax::Node> *)((long)&nextNodeIndex + 2));
  std::allocator<jhu::thrax::Node>::~allocator
            ((allocator<jhu::thrax::Node> *)((long)&nextNodeIndex + 2));
  curr = (Node *)0x0;
  __range2 = (Sentence *)0x0;
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_38);
  t._M_str = (char *)std::
                     vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)local_38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&t._M_str);
    if (!bVar1) {
      if (__range2 != (Sentence *)0x0) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_1a8,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   &tokens.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a9);
        std::operator+(&local_188,"bad tree: ",&local_1a8);
        std::invalid_argument::invalid_argument(piVar6,(string *)&local_188);
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      nextNodeIndex._3_1_ = 1;
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_38);
      return __return_storage_ptr__;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2);
    _auStack_b0 = pbVar3->_M_len;
    t._M_len = (size_t)pbVar3->_M_str;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0);
    if (*pvVar4 == '(') {
      if (__range2 == (Sentence *)0x0) {
        local_b2 = 0;
      }
      else {
        local_b2 = *(undefined2 *)
                    ((long)&(__range2->
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0,1);
      local_d8 = local_b2;
      uStack_d6 = local_b2;
      local_d0 = _auStack_b0;
      local_c8 = (char *)t._M_len;
      local_c0 = (Node *)__range2;
      pvVar5 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::operator[]
                         (__return_storage_ptr__,(size_type)curr);
      *(ulong *)pvVar5 = CONCAT44(uStack_d4,CONCAT22(uStack_d6,local_d8));
      (pvVar5->label)._M_len = local_d0;
      (pvVar5->label)._M_str = local_c8;
      pvVar5->parent = local_c0;
      __range2 = (Sentence *)
                 std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::operator[]
                           (__return_storage_ptr__,(size_type)curr);
      curr = (Node *)((long)&(curr->span).start + 1);
    }
    else {
      if (__range2 == (Sentence *)0x0) {
        local_11a = 1;
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_118,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   &tokens.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_119);
        std::operator+(&local_f8,"bad tree: ",&local_118);
        std::invalid_argument::invalid_argument(piVar6,(string *)&local_f8);
        local_11a = 0;
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      Node::add_suffix((Node *)__range2);
    }
    while( true ) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0);
      bVar1 = false;
      if (!bVar2) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0);
        bVar1 = *pvVar4 == ')';
      }
      if (!bVar1) break;
      if (__range2 == (Sentence *)0x0) {
        local_162 = 1;
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_160,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   &tokens.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_161);
        std::operator+(&local_140,"bad tree: ",&local_160);
        std::invalid_argument::invalid_argument(piVar6,(string *)&local_140);
        local_162 = 0;
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      __range2 = (Sentence *)
                 __range2[1].
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0,1);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Tree readTree(std::string_view line) {
  auto tokens = split(line);
  auto nodeCount = std::count_if(
      tokens.begin(), tokens.end(), [](auto t) { return t.front() == '('; });
  Tree result(nodeCount);
  size_t nextNodeIndex = 0;
  Node* curr = nullptr;
  for (auto t : tokens) {
    if (t.front() == '(') {
      IndexType start = curr == nullptr ? 0 : curr->span.end;
      t.remove_prefix(1);
      result[nextNodeIndex] = Node{ { start, start }, t, curr };
      curr = &result[nextNodeIndex++];
    } else {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr->add_suffix();
    }
    while (!t.empty() && t.back() == ')') {
      if (curr == nullptr) {
        throw std::invalid_argument("bad tree: " + std::string(line));
      }
      curr = curr->parent;
      t.remove_suffix(1);
    }
  }
  if (curr != nullptr) {
    // Not enough close parens
    throw std::invalid_argument("bad tree: " + std::string(line));
  }
  return result;
}